

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall BuildTestMakeDirs::Run(BuildTestMakeDirs *this)

{
  Builder *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  string err;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  iVar3 = g_current_test->assertion_failures_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "build subdir/dir2/file: cat in1\n",(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  iVar4 = g_current_test->assertion_failures_;
  if (iVar3 == iVar4) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subdir/dir2/file","");
    this_00 = &(this->super_BuildTest).builder_;
    pNVar5 = Builder::AddTarget(this_00,&local_50,&local_70);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x39c,"builder_.AddTarget(\"subdir/dir2/file\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pTVar1 = g_current_test;
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    testing::Test::Check
              (pTVar1,iVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x39e,"\"\" == err");
    pTVar1 = g_current_test;
    bVar2 = Builder::Build(this_00,&local_70);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x39f,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3a0,"\"\" == err");
    if (bVar2) {
      bVar2 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_BuildTest).fs_.directories_made_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_BuildTest).fs_.directories_made_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x40,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3a1,"2u == fs_.directories_made_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)(this->super_BuildTest).fs_.directories_made_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        testing::Test::Check
                  (pTVar1,iVar3 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3a2,"\"subdir\" == fs_.directories_made_[0]");
        pTVar1 = g_current_test;
        iVar3 = std::__cxx11::string::compare
                          ((char *)((this->super_BuildTest).fs_.directories_made_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
        testing::Test::Check
                  (pTVar1,iVar3 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3a3,"\"subdir/dir2\" == fs_.directories_made_[1]");
        goto LAB_0012bc23;
      }
    }
    iVar4 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar4 + 1;
LAB_0012bc23:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTest, MakeDirs) {
  string err;

#ifdef _WIN32
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build subdir\\dir2\\file: cat in1\n"));
#else
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build subdir/dir2/file: cat in1\n"));
#endif
  EXPECT_TRUE(builder_.AddTarget("subdir/dir2/file", &err));

  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, fs_.directories_made_.size());
  EXPECT_EQ("subdir", fs_.directories_made_[0]);
  EXPECT_EQ("subdir/dir2", fs_.directories_made_[1]);
}